

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_movep(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 ret;
  uint16_t uVar1;
  TCGv_i32 pTVar2;
  TCGv_i32 ret_00;
  TCGv_i32 dbuf;
  TCGv_i32 abuf;
  TCGv_i32 addr;
  TCGv_i32 reg;
  int16_t displ;
  uint8_t i;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = read_im16(env,s);
  pTVar2 = get_areg(s,insn & 7);
  ret = tcg_ctx_00->cpu_dregs[(int)((int)(uint)insn >> 9 & 7)];
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  tcg_gen_addi_i32_m68k(tcg_ctx_00,ret_00,pTVar2,(int)(short)uVar1);
  pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
  if ((insn & 0x40) == 0) {
    reg._7_1_ = 2;
  }
  else {
    reg._7_1_ = 4;
  }
  if ((insn & 0x80) == 0) {
    for (; reg._7_1_ != 0; reg._7_1_ = reg._7_1_ - 1) {
      tcg_gen_qemu_ld8u(tcg_ctx_00,pTVar2,ret_00,
                        (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
      tcg_gen_deposit_i32_m68k(tcg_ctx_00,ret,ret,pTVar2,(reg._7_1_ - 1) * 8,8);
      if (1 < reg._7_1_) {
        tcg_gen_addi_i32_m68k(tcg_ctx_00,ret_00,ret_00,2);
      }
    }
  }
  else {
    for (; reg._7_1_ != 0; reg._7_1_ = reg._7_1_ - 1) {
      tcg_gen_shri_i32_m68k(tcg_ctx_00,pTVar2,ret,(reg._7_1_ - 1) * 8);
      tcg_gen_qemu_st8(tcg_ctx_00,pTVar2,ret_00,
                       (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
      if (1 < reg._7_1_) {
        tcg_gen_addi_i32_m68k(tcg_ctx_00,ret_00,ret_00,2);
      }
    }
  }
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  tcg_temp_free_i32(tcg_ctx_00,pTVar2);
  return;
}

Assistant:

DISAS_INSN(movep)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint8_t i;
    int16_t displ;
    TCGv reg;
    TCGv addr;
    TCGv abuf;
    TCGv dbuf;

    displ = read_im16(env, s);

    addr = AREG(insn, 0);
    reg = DREG(insn, 9);

    abuf = tcg_temp_new(tcg_ctx);
    tcg_gen_addi_i32(tcg_ctx, abuf, addr, displ);
    dbuf = tcg_temp_new(tcg_ctx);

    if (insn & 0x40) {
        i = 4;
    } else {
        i = 2;
    }

    if (insn & 0x80) {
        for ( ; i > 0 ; i--) {
            tcg_gen_shri_i32(tcg_ctx, dbuf, reg, (i - 1) * 8);
            tcg_gen_qemu_st8(tcg_ctx, dbuf, abuf, IS_USER(s));
            if (i > 1) {
                tcg_gen_addi_i32(tcg_ctx, abuf, abuf, 2);
            }
        }
    } else {
        for ( ; i > 0 ; i--) {
            tcg_gen_qemu_ld8u(tcg_ctx, dbuf, abuf, IS_USER(s));
            tcg_gen_deposit_i32(tcg_ctx, reg, reg, dbuf, (i - 1) * 8, 8);
            if (i > 1) {
                tcg_gen_addi_i32(tcg_ctx, abuf, abuf, 2);
            }
        }
    }
    tcg_temp_free(tcg_ctx, abuf);
    tcg_temp_free(tcg_ctx, dbuf);
}